

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O2

void __thiscall Dumper::nodeToDot(Dumper *this,RWNode *node)

{
  long lVar1;
  RWNode *node_00;
  int iVar2;
  RWCalledValue *cv;
  long lVar3;
  pair<std::_Rb_tree_iterator<dg::dda::RWNode_*>,_bool> pVar4;
  RWNode *local_30;
  
  local_30 = node;
  if (nodeToDot(dg::dda::RWNode*)::_dumped == '\0') {
    iVar2 = __cxa_guard_acquire(&nodeToDot(dg::dda::RWNode*)::_dumped);
    if (iVar2 != 0) {
      nodeToDot::_dumped._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      nodeToDot::_dumped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      nodeToDot::_dumped._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &nodeToDot::_dumped._M_t._M_impl.super__Rb_tree_header._M_header;
      nodeToDot::_dumped._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &nodeToDot::_dumped._M_t._M_impl.super__Rb_tree_header._M_header;
      nodeToDot::_dumped._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(std::
                   set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                   ::~set,&nodeToDot::_dumped,&__dso_handle);
      __cxa_guard_release(&nodeToDot(dg::dda::RWNode*)::_dumped);
    }
  }
  pVar4 = std::
          _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
          ::_M_insert_unique<dg::dda::RWNode*const&>
                    ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                      *)&nodeToDot::_dumped,&local_30);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    printf("\tNODE%p ",local_30);
    printf("[label=<<table border=\"0\"><tr><td>(%u)</td> ",(ulong)*(uint *)(local_30 + 8));
    printf("<td><font color=\"#af0000\">");
    printName(this,local_30);
    printf("</font></td>");
    puts("</tr>");
    if (*(long *)(local_30 + 0x88) != 0) {
      printf("<tr><td></td><td>size: %zu</td></tr>\n");
    }
    if (verbose[0x80] == '\x01') {
      printf("<tr><td>type:</td><td>");
      printRWNodeType(*(RWNodeType *)(local_30 + 0x90));
      puts("</td></tr>");
      printf("<tr><td colspan=\"2\">bblock: %p</td></tr>\n",*(undefined8 *)(local_30 + 0x98));
      dumpDefines(this,local_30);
      dumpOverwrites(this,local_30);
      dumpUses(this,local_30);
    }
    if ((local_30 != (RWNode *)0x0) && (*(int *)(local_30 + 0x90) == 0xd)) {
      lVar1 = *(long *)(local_30 + 0x160);
      for (lVar3 = *(long *)(local_30 + 0x158); lVar3 != lVar1; lVar3 = lVar3 + 0x10) {
        node_00 = *(RWNode **)(lVar3 + 8);
        if (node_00 != (RWNode *)0x0) {
          puts("<tr><td></td><td>------ undef call ------</td></tr>");
          dumpDefines(this,node_00);
          dumpOverwrites(this,node_00);
          dumpUses(this,node_00);
        }
      }
    }
    puts("</table>>");
    puts(" style=filled fillcolor=white shape=box]");
  }
  return;
}

Assistant:

void nodeToDot(RWNode *node) {
        static std::set<RWNode *> _dumped;
        if (!_dumped.insert(node).second) // already dumped
            return;

        printf("\tNODE%p ", static_cast<const void *>(node));
        printf("[label=<<table border=\"0\"><tr><td>(%u)</td> ", node->getID());
        printf("<td><font color=\"#af0000\">");
        printName(node);
        printf("</font></td>");
        printf("</tr>\n");

        if (node->getSize() > 0) {
            printf("<tr><td></td><td>size: %zu</td></tr>\n", node->getSize());
        }

        if (verbose) {
            printf("<tr><td>type:</td><td>");
            printRWNodeType(node->getType());
            printf("</td></tr>\n");
            printf("<tr><td colspan=\"2\">bblock: %p</td></tr>\n",
                   node->getBBlock());
            dumpDefines(node);
            dumpOverwrites(node);
            dumpUses(node);
        }

        // dumped data for undefined functions
        // (call edges will be dumped with other edges)
        if (auto *C = RWNodeCall::get(node)) {
            for (auto &cv : C->getCallees()) {
                if (const RWNode *undef = cv.getCalledValue()) {
                    printf("<tr><td></td><td>------ undef call "
                           "------</td></tr>\n");
                    dumpDefines(undef);
                    dumpOverwrites(undef);
                    dumpUses(undef);
                }
            }
        }

        puts("</table>>"); // end of label
        printf(" style=filled fillcolor=white shape=box]\n");
    }